

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.hpp
# Opt level: O0

token_value * __thiscall cs::compiler_type::new_value(compiler_type *this,var *val)

{
  token_value *this_00;
  any *in_stack_ffffffffffffffc8;
  compiler_type *in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd8;
  undefined4 uVar1;
  undefined4 in_stack_ffffffffffffffdc;
  token_value *in_stack_ffffffffffffffe0;
  
  add_constant(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  this_00 = (token_value *)token_base::operator_new((size_t)in_stack_ffffffffffffffd0);
  uVar1 = CONCAT13(1,(int3)in_stack_ffffffffffffffd8);
  cs_impl::any::any((any *)this_00,in_stack_ffffffffffffffc8);
  token_value::token_value
            (in_stack_ffffffffffffffe0,(var *)CONCAT44(in_stack_ffffffffffffffdc,uVar1));
  cs_impl::any::~any((any *)0x1450b2);
  return this_00;
}

Assistant:

token_value *new_value(const var &val)
		{
			add_constant(val);
			return new token_value(val);
		}